

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O1

ZyanStatus
ZydisDecoderDecodeInstruction
          (ZydisDecoder *decoder,ZydisDecoderContext *context,void *buffer,ZyanUSize length,
          ZydisDecodedInstruction *instruction)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  undefined3 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined3 uVar9;
  uint uVar10;
  ZyanStatus ZVar11;
  ZyanU8 ZVar12;
  ZydisDecoderContext *pZVar13;
  byte bVar14;
  uint uVar15;
  byte bVar16;
  byte *pbVar17;
  ZyanUSize ZVar18;
  uint in_R11D;
  ZyanStatus ZVar19;
  uint uVar20;
  ulong uVar21;
  ZydisDecoderState state;
  ZydisDecoderContext default_context;
  byte local_89;
  ZydisDecoderState local_88;
  ZydisDecoderContext *local_58;
  ZydisDecoderContext local_50;
  
  ZVar11 = 0x80100004;
  if (((buffer != (void *)0x0) && (decoder != (ZydisDecoder *)0x0)) &&
     (instruction != (ZydisDecodedInstruction *)0x0)) {
    if (length == 0) {
      ZVar11 = 0x80200000;
    }
    else {
      local_88.prefixes.has_lock = '\0';
      local_88.prefixes.group1 = '\0';
      local_88.prefixes.group2 = '\0';
      local_88.prefixes.effective_segment = '\0';
      local_88.prefixes.mandatory_candidate = '\0';
      local_88.prefixes.offset_lock = '\0';
      local_88.prefixes.offset_group1 = '\0';
      local_88.prefixes.offset_group2 = '\0';
      local_88.context = context;
      if (context == (ZydisDecoderContext *)0x0) {
        local_88.context = &local_50;
      }
      local_88.prefixes.offset_osz_override = '\0';
      local_88.prefixes.offset_asz_override = '\0';
      local_88.prefixes.offset_segment = '\0';
      local_88.prefixes.offset_mandatory = '\0';
      local_88.prefixes.offset_notrack = -1;
      local_88._45_3_ = 0;
      *(undefined8 *)&((local_88.context)->vector_unified).R2 = 0;
      *(undefined8 *)&((local_88.context)->reg_info).id_base = 0;
      (local_88.context)->definition = (void *)0x0;
      (local_88.context)->eosz_index = '\0';
      (local_88.context)->easz_index = '\0';
      ((local_88.context)->vector_unified).W = '\0';
      ((local_88.context)->vector_unified).R = '\0';
      ((local_88.context)->vector_unified).X = '\0';
      ((local_88.context)->vector_unified).B = '\0';
      ((local_88.context)->vector_unified).L = '\0';
      ((local_88.context)->vector_unified).LL = '\0';
      local_88.decoder = decoder;
      local_88.buffer = (ZyanU8 *)buffer;
      local_88.buffer_len = length;
      local_58 = context;
      memset(instruction,0,0x148);
      instruction->machine_mode = decoder->machine_mode;
      instruction->stack_width = (ZyanU8)(0x10 << ((char)decoder->stack_width & 0x1f));
      if ((instruction->raw).prefix_count != '\0') {
        __assert_fail("instruction->raw.prefix_count == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xc11,
                      "ZyanStatus ZydisCollectOptionalPrefixes(ZydisDecoderState *, ZydisDecodedInstruction *)"
                     );
      }
      bVar16 = instruction->length;
      local_89 = local_88.prefixes.mandatory_candidate;
      uVar15 = (uint)local_88.prefixes.effective_segment;
      uVar10 = 0;
      ZVar12 = '\0';
      bVar4 = false;
      pbVar17 = local_88.buffer;
      ZVar18 = local_88.buffer_len;
      do {
        uVar6 = local_88.prefixes._0_8_;
        if (bVar16 < 0xf) {
          if (ZVar18 == 0) {
            ZVar19 = 0x80200000;
            goto LAB_0010e4ce;
          }
          in_R11D = (uint)*pbVar17;
          ZVar19 = 0x100000;
          bVar3 = true;
        }
        else {
          ZVar19 = 0x80200002;
LAB_0010e4ce:
          bVar3 = false;
        }
        if (bVar3) {
          uVar20 = in_R11D & 0xff;
          bVar14 = (byte)in_R11D;
          uVar5 = local_88.prefixes._5_3_;
          uVar8 = local_88._44_4_;
          if (uVar20 < 0x67) {
            uVar1 = uVar20 - 0x26;
            if (uVar1 < 0x40) {
              uVar9 = local_88._45_3_;
              if ((0x1010101UL >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
                if ((0xc000000000000000U >> ((ulong)uVar1 & 0x3f) & 1) == 0) goto LAB_0010e5aa;
              }
              else if (decoder->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
                if ((bVar14 == 0x3e) && (((byte)uVar15 & 0xfe) != 100)) {
                  local_88.prefixes.offset_notrack = ZVar12;
                }
                local_88.prefixes.group2 = bVar14;
                local_88.prefixes.offset_group2 = ZVar12;
                goto LAB_0010e5eb;
              }
              local_88.prefixes.group2 = bVar14;
              uVar5 = local_88.prefixes._0_3_;
              local_88.prefixes.offset_group2 = ZVar12;
              local_88.prefixes.effective_segment = bVar14;
              local_88.prefixes._0_4_ = CONCAT13(local_88.prefixes.effective_segment,uVar5);
              local_88.prefixes.offset_segment = ZVar12;
              local_88.prefixes.offset_notrack = -1;
              local_88._40_8_ = CONCAT35(uVar9,local_88.prefixes._8_5_);
              uVar15 = in_R11D;
            }
            else {
LAB_0010e5aa:
              if (uVar20 == 0x66) {
                local_88.prefixes.offset_osz_override = ZVar12;
                if (local_89 == 0) {
                  local_88.prefixes.mandatory_candidate = 'f';
                  local_88.prefixes._0_8_ = CONCAT35(uVar5,local_88.prefixes._0_5_);
                  local_88.prefixes.offset_mandatory = ZVar12;
                  local_88._40_8_ = CONCAT44(uVar8,local_88.prefixes._8_4_);
                  local_89 = 0x66;
                }
                uVar21 = 0x80000000000;
LAB_0010e5e7:
                instruction->attributes = instruction->attributes | uVar21;
              }
              else {
LAB_0010e655:
                if (((bVar14 & 0xf0) == 0x40) &&
                   (decoder->machine_mode == ZYDIS_MACHINE_MODE_LONG_64)) {
                  (instruction->raw).field_3.rex.offset = ZVar12;
                  uVar10 = in_R11D;
                }
                else {
                  bVar4 = true;
                }
              }
            }
          }
          else if (uVar20 - 0xf2 < 2) {
            local_88.prefixes.group1 = bVar14;
            local_88.prefixes.mandatory_candidate = bVar14;
            local_88.prefixes._0_8_ = CONCAT35(uVar5,local_88.prefixes._0_5_);
            uVar7 = local_88.prefixes._0_8_;
            local_88.prefixes.offset_group2 = SUB81(uVar6,7);
            local_88.prefixes._0_6_ = SUB86(uVar7,0);
            local_88.prefixes.offset_group1 = ZVar12;
            local_88.prefixes.offset_mandatory = ZVar12;
            local_89 = bVar14;
          }
          else {
            if (uVar20 == 0x67) {
              local_88.prefixes.offset_asz_override = ZVar12;
              uVar21 = 0x100000000000;
              goto LAB_0010e5e7;
            }
            if (uVar20 != 0xf0) goto LAB_0010e655;
            local_88.prefixes.has_lock = '\x01';
            uVar7 = local_88.prefixes._0_8_;
            local_88.prefixes._6_2_ = SUB82(uVar6,6);
            local_88.prefixes._0_5_ = SUB85(uVar7,0);
            local_88.prefixes.offset_lock = ZVar12;
          }
LAB_0010e5eb:
          ZVar19 = ZVar11;
          if (!bVar4) {
            if ((byte)uVar10 != bVar14 && (byte)uVar10 != 0) {
              (instruction->raw).field_3.rex.offset = '\0';
              uVar10 = 0;
            }
            bVar2 = (instruction->raw).prefix_count;
            (instruction->raw).prefix_count = bVar2 + 1;
            (instruction->raw).prefixes[bVar2].value = bVar14;
            if (0xe < bVar16) {
              __assert_fail("instruction->length < 15",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x119,
                            "void ZydisInputSkip(ZydisDecoderState *, ZydisDecodedInstruction *)");
            }
            bVar16 = bVar16 + 1;
            instruction->length = bVar16;
            pbVar17 = pbVar17 + 1;
            ZVar18 = ZVar18 - 1;
            ZVar12 = ZVar12 + '\x01';
            local_88.buffer = pbVar17;
            local_88.buffer_len = ZVar18;
          }
        }
        ZVar11 = ZVar19;
        if (!bVar3) goto LAB_0010e771;
      } while (!bVar4);
      uVar21 = instruction->attributes;
      if ((uVar21 & 0x80000000000) != 0) {
        (instruction->raw).prefixes[local_88._40_8_ & 0xff].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
      }
      if ((uVar21 & 0x100000000000) != 0) {
        (instruction->raw).prefixes[(ulong)local_88._40_8_ >> 8 & 0xff].type =
             ZYDIS_PREFIX_TYPE_EFFECTIVE;
      }
      bVar16 = (byte)uVar10;
      if (bVar16 != 0) {
        (instruction->raw).prefixes[(instruction->raw).field_3.rex.offset].type =
             ZYDIS_PREFIX_TYPE_EFFECTIVE;
        if ((bVar16 & 0xf0) != 0x40) {
          __assert_fail("(data & 0xF0) == 0x40",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x17a,
                        "void ZydisDecodeREX(ZydisDecoderContext *, ZydisDecodedInstruction *, ZyanU8)"
                       );
        }
        bVar14 = bVar16 >> 3 & 1;
        instruction->attributes = uVar21 | 4;
        (instruction->raw).field_3.rex.W = bVar14;
        (instruction->raw).field_3.rex.R = bVar16 >> 2 & 1;
        (instruction->raw).field_3.rex.X = bVar16 >> 1 & 1;
        pZVar13 = &local_50;
        if (local_58 != (ZydisDecoderContext *)0x0) {
          pZVar13 = local_58;
        }
        (instruction->raw).field_3.rex.B = bVar16 & 1;
        (pZVar13->vector_unified).W = bVar14;
        (pZVar13->vector_unified).R = (instruction->raw).field_3.rex.R;
        (pZVar13->vector_unified).X = (instruction->raw).field_3.rex.X;
        (pZVar13->vector_unified).B = (instruction->raw).field_3.rex.B;
      }
      ZVar11 = 0x100000;
      if ((decoder->machine_mode != ZYDIS_MACHINE_MODE_LONG_64) && (local_88.prefixes.group2 == '>')
         ) {
        local_88.prefixes.offset_notrack = local_88.prefixes.offset_group2;
      }
LAB_0010e771:
      if ((-1 < (int)ZVar11) &&
         (ZVar11 = ZydisDecodeInstruction(&local_88,instruction), -1 < (int)ZVar11)) {
        (instruction->raw).encoding2 = instruction->encoding;
        ZVar11 = 0x100000;
      }
    }
  }
  return ZVar11;
}

Assistant:

ZyanStatus ZydisDecoderDecodeInstruction(const ZydisDecoder* decoder, ZydisDecoderContext* context,
    const void* buffer, ZyanUSize length, ZydisDecodedInstruction* instruction)
{
    if (!decoder || !instruction || !buffer)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (!length)
    {
        return ZYDIS_STATUS_NO_MORE_DATA;
    }

    ZydisDecoderState state;
    ZYAN_MEMSET(&state, 0, sizeof(state));
    state.decoder = decoder;
    state.buffer = (const ZyanU8*)buffer;
    state.buffer_len = length;
    state.prefixes.offset_notrack = -1;

    ZydisDecoderContext default_context;
    if (!context)
    {
        // Use a fallback context if no custom one has been provided
        context = &default_context;
    }
    ZYAN_MEMSET(context, 0, sizeof(*context));
    state.context = context;

    ZYAN_MEMSET(instruction, 0, sizeof(*instruction));
    instruction->machine_mode = decoder->machine_mode;
    instruction->stack_width = 16 << decoder->stack_width;

    ZYAN_CHECK(ZydisCollectOptionalPrefixes(&state, instruction));
    ZYAN_CHECK(ZydisDecodeInstruction(&state, instruction));

    instruction->raw.encoding2 = instruction->encoding;

    return ZYAN_STATUS_SUCCESS;
}